

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::WriteNL
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *this,
          string *namebase)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  NLUtils *pNVar6;
  NLHeader *pNVar7;
  FeederType *__lhs;
  FeederType *pFVar8;
  FILE *__stream;
  int *piVar9;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *in_RDI;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *in_stack_00000080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fln;
  File *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string local_c8 [8];
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *in_stack_ffffffffffffff40;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *in_stack_ffffffffffffff50;
  string local_a8 [32];
  string local_88 [8];
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *in_stack_ffffffffffffff80;
  string local_68 [8];
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *in_stack_ffffffffffffffa0;
  undefined1 local_38 [8];
  string local_30 [48];
  
  std::operator+(in_stack_ffffffffffffff18,
                 (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  pNVar6 = TextFormatter::Utils(&in_RDI->super_FormatterType);
  pNVar7 = Hdr(in_RDI);
  (*pNVar6->_vptr_NLUtils[2])
            (local_38,pNVar6,local_30,
             (ulong)((pNVar7->super_NLProblemInfo).super_NLProblemInfo_C.num_vars < 1),"wb");
  File::operator=((File *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  in_stack_fffffffffffffee8);
  File::~File((File *)0x12db2c);
  bVar1 = File::operator_cast_to_bool(&in_RDI->nm);
  if (bVar1) {
    WriteNLHeader(in_stack_00000080);
    iVar4 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    WriteFunctions((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
                   CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    WriteSuffixes((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    WritePLSOSConstraints
              ((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    __lhs = Feeder(in_RDI);
    uVar2 = NLFeeder<mp::NLFeeder_Easy,_void_*>::WantBoundsFirst
                      ((NLFeeder<mp::NLFeeder_Easy,_void_*> *)__lhs);
    if ((bool)uVar2) {
      WriteVarBounds((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
                     CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      WriteInitialGuesses(in_stack_ffffffffffffff40);
      WriteConBounds((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
                     CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      WriteDualInitialGuesses(in_stack_ffffffffffffff40);
    }
    WriteDefinedVariables
              ((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),iVar4);
    WriteConObjExpressions(in_stack_ffffffffffffffa0);
    pFVar8 = Feeder(in_RDI);
    uVar3 = NLFeeder<mp::NLFeeder_Easy,_void_*>::WantBoundsFirst
                      ((NLFeeder<mp::NLFeeder_Easy,_void_*> *)pFVar8);
    if (!(bool)uVar3) {
      WriteDualInitialGuesses(in_stack_ffffffffffffff40);
      WriteInitialGuesses(in_stack_ffffffffffffff40);
      WriteConBounds((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
                     CONCAT17(uVar3,in_stack_ffffffffffffff00));
      WriteVarBounds((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
                     CONCAT17(uVar3,in_stack_ffffffffffffff00));
    }
    pFVar8 = Feeder(in_RDI);
    iVar4 = NLFeeder<mp::NLFeeder_Easy,_void_*>::WantColumnSizes
                      ((NLFeeder<mp::NLFeeder_Easy,_void_*> *)pFVar8);
    if (iVar4 != 0) {
      WriteColumnSizes(in_stack_ffffffffffffff50);
    }
    WriteLinearConExpr(in_stack_ffffffffffffff80);
    WriteObjGradients(in_stack_ffffffffffffff80);
    WriteRandomVariables
              ((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
               CONCAT44(iVar4,in_stack_fffffffffffffef0));
    __stream = (FILE *)File::GetHandle(&in_RDI->nm);
    iVar5 = ferror(__stream);
    if (iVar5 == 0) {
      (in_RDI->result_).first = NLW2_WriteNL_OK;
    }
    else {
      (in_RDI->result_).first = NLW2_WriteNL_Failed;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)CONCAT17(uVar2,in_stack_ffffffffffffff10));
      piVar9 = __errno_location();
      strerror(*piVar9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar8,
                     (char *)CONCAT44(iVar4,in_stack_fffffffffffffef0));
      std::__cxx11::string::operator=((string *)&(in_RDI->result_).second,local_68);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_88);
    }
  }
  else {
    (in_RDI->result_).first = NLW2_WriteNL_CantOpen;
    std::operator+(in_stack_ffffffffffffff18,
                   (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    piVar9 = __errno_location();
    strerror(*piVar9);
    std::operator+(in_stack_fffffffffffffef8,
                   (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    std::__cxx11::string::operator=((string *)&(in_RDI->result_).second,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void NLWriter2<Params>::WriteNL(
    const std::string& namebase) {
  auto fln = namebase + ".nl";
  nm = Utils().openf(fln,
                     Hdr().num_vars<=0,     // Delete file if true
                     "wb");
  if (nm) {
    WriteNLHeader();
    WriteFunctions();
    WriteSuffixes();
    WritePLSOSConstraints();
    if (Feeder().WantBoundsFirst()) {
      WriteVarBounds();
      WriteInitialGuesses();
      WriteConBounds();
      WriteDualInitialGuesses();
    }
    WriteDefinedVariables(0);
    WriteConObjExpressions();
    if (!Feeder().WantBoundsFirst()) {
      WriteDualInitialGuesses();
      WriteInitialGuesses();
      WriteConBounds();
      WriteVarBounds();
    }
    if (Feeder().WantColumnSizes())
      WriteColumnSizes();
    WriteLinearConExpr();
    WriteObjGradients();
    WriteRandomVariables();

    if (std::ferror(nm.GetHandle())) {
      result_.first = NLW2_WriteNL_Failed;
      result_.second = fln + ": " + std::strerror(errno);
    } else
      result_.first = NLW2_WriteNL_OK;
  } else {
    result_.first = NLW2_WriteNL_CantOpen;
    result_.second = fln + ": " + std::strerror(errno);
  }
}